

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

EVaction old_EVassoc_filter_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   EVstone out_stone,void *client_data)

{
  FMFieldList list;
  int iVar1;
  EVaction EVar2;
  CMFormatList pCVar3;
  FMStructDescList incoming_format_list;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  uVar5 = (ulong)(uint)stone;
  uVar6 = 0;
  for (pCVar3 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar3->format_name != (char *)0x0));
      pCVar3 = pCVar3 + 1) {
    uVar6 = uVar6 + 1;
  }
  uVar4 = (ulong)uVar6;
  incoming_format_list = (FMStructDescList)INT_CMmalloc(uVar4 * 0x20 + 0x20);
  if (uVar6 != 0) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&incoming_format_list->format_name + lVar7 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar7);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar7);
      *(FMFieldList *)((long)&incoming_format_list->field_list + lVar7 * 2) = list;
      iVar1 = struct_size_field_list(list,(int)uVar5);
      *(int *)((long)&incoming_format_list->struct_size + lVar7 * 2) = iVar1;
      *(undefined8 *)((long)&incoming_format_list->opt_info + lVar7 * 2) = 0;
      lVar7 = lVar7 + 0x10;
    } while (uVar4 << 4 != lVar7);
  }
  incoming_format_list[uVar4].format_name = (char *)0x0;
  incoming_format_list[uVar4].field_list = (FMFieldList)0x0;
  EVar2 = EVassoc_filter_action(cm,stone,incoming_format_list,handler,out_stone,client_data);
  return EVar2;
}

Assistant:

extern EVaction
old_EVassoc_filter_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, EVstone out_stone, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_filter_action(cm, stone, structs, handler, out_stone, client_data);
}